

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

int adios2::utils::compile_regexp_masks(void)

{
  int __errcode;
  undefined1 *__preg;
  long lVar1;
  undefined8 *puVar2;
  char buf [256];
  char acStack_118 [256];
  
  if (nmasks < 1) {
    return 0;
  }
  puVar2 = &varmask;
  __preg = varregex;
  lVar1 = 0;
  do {
    __errcode = regcomp((regex_t *)__preg,(char *)*puVar2,1);
    if (__errcode != 0) {
      regerror(__errcode,(regex_t *)__preg,acStack_118,0x100);
      fprintf(_stderr,"Error: \"%s\" is an invalid extended regular expression: %s\n",*puVar2,
              acStack_118);
      return 2;
    }
    lVar1 = lVar1 + 1;
    puVar2 = puVar2 + 1;
    __preg = (undefined1 *)((long)__preg + 0x40);
  } while (lVar1 < nmasks);
  return 0;
}

Assistant:

int compile_regexp_masks(void)
{
#ifdef USE_C_REGEX
    int errcode;
    char buf[256];
    for (int i = 0; i < nmasks; i++)
    {
        errcode = regcomp(&(varregex[i]), varmask[i], REG_EXTENDED);
        if (errcode)
        {
            regerror(errcode, &(varregex[i]), buf, sizeof(buf));
            fprintf(stderr,
                    "Error: \"%s\" is an invalid extended regular "
                    "expression: %s\n",
                    varmask[i], buf);
            return 2;
        }
    }
#else
    varregex.reserve(nmasks);
    for (int i = 0; i < nmasks; i++)
    {
        try
        {
            varregex.push_back(std::regex(varmask[i]));
        }
        catch (std::regex_error &e)
        {
            fprintf(stderr,
                    "Error: \"%s\" is an invalid extended regular "
                    "expression. C++ regex error code: %d\n",
                    varmask[i], e.code() == std::regex_constants::error_badrepeat);
            return 2;
        }
    }
#endif
    return 0;
}